

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrintErrorHandler.cpp
# Opt level: O0

bool __thiscall DOMPrintErrorHandler::handleError(DOMPrintErrorHandler *this,DOMError *domError)

{
  int iVar1;
  wchar16 *pwVar2;
  ostream *this_00;
  char *local_20;
  char *msg;
  DOMError *domError_local;
  DOMPrintErrorHandler *this_local;
  
  msg = (char *)domError;
  domError_local = (DOMError *)this;
  iVar1 = (**(code **)(*(long *)domError + 0x10))();
  if (iVar1 == 1) {
    std::operator<<((ostream *)&std::cerr,"\nWarning Message: ");
  }
  else {
    iVar1 = (**(code **)(*(long *)msg + 0x10))();
    if (iVar1 == 2) {
      std::operator<<((ostream *)&std::cerr,"\nError Message: ");
    }
    else {
      std::operator<<((ostream *)&std::cerr,"\nFatal Message: ");
    }
  }
  pwVar2 = (wchar16 *)(**(code **)(*(long *)msg + 0x18))();
  local_20 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this_00 = std::operator<<((ostream *)&std::cerr,local_20);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  xercesc_4_0::XMLString::release(&local_20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return true;
}

Assistant:

bool DOMPrintErrorHandler::handleError(const DOMError &domError)
{
    // Display whatever error message passed from the serializer
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning Message: ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
        std::cerr << "\nError Message: ";
    else
        std::cerr << "\nFatal Message: ";

    char *msg = XMLString::transcode(domError.getMessage());
    std::cerr<< msg <<std::endl;
    XMLString::release(&msg);

    // Instructs the serializer to continue serialization if possible.
    return true;
}